

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

void __thiscall
pbrt::
HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::Insert(HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
         *this,int *key,int *value)

{
  optional<std::pair<int,_int>_> *poVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  aligned_storage_t<sizeof(std::pair<int,_int>),_alignof(std::pair<int,_int>)> aVar6;
  
  sVar4 = FindOffset(this,key);
  if (((this->table).ptr[sVar4].set == false) &&
     (sVar5 = this->nStored + 1, this->nStored = sVar5, (this->table).nStored < sVar5 * 3)) {
    Grow(this);
    sVar4 = FindOffset(this,key);
  }
  iVar2 = *key;
  iVar3 = *value;
  poVar1 = (this->table).ptr + sVar4;
  if (poVar1->set == true) {
    poVar1->set = false;
  }
  aVar6._4_4_ = iVar3;
  aVar6.__align = (anon_struct_4_0_00000001_for___align)iVar2;
  poVar1->optionalValue = aVar6;
  poVar1->set = true;
  return;
}

Assistant:

void Insert(const Key &key, const Value &value) {
        size_t offset = FindOffset(key);
        if (table[offset].has_value() == false) {
            // Not there already; possibly grow.
            if (3 * ++nStored > capacity()) {
                Grow();
                offset = FindOffset(key);
            }
        }
        table[offset] = std::make_pair(key, value);
    }